

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_child(xml_node *this,xml_node *n)

{
  bool bVar1;
  xml_allocator *this_00;
  xml_allocator *alloc;
  xml_node *n_local;
  xml_node *this_local;
  
  if (((this->_root == (xml_node_struct *)0x0) || (n->_root == (xml_node_struct *)0x0)) ||
     (n->_root->parent != this->_root)) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar1) {
      impl::anon_unknown_0::remove_node(n->_root);
      impl::anon_unknown_0::destroy_node(n->_root,this_00);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_child(const xml_node& n)
	{
		if (!_root || !n._root || n._root->parent != _root) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_node(n._root);
		impl::destroy_node(n._root, alloc);

		return true;
	}